

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O0

void __thiscall NaPNFetcher::set_output(NaPNFetcher *this,int nDim,uint *piMap)

{
  undefined1 auVar1 [16];
  undefined4 *puVar2;
  ulong uVar3;
  void *pvVar4;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int i;
  int local_1c;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x14d431);
  *(undefined4 *)(in_RDI + 0x120) = in_ESI;
  if (*(void **)(in_RDI + 0x110) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x110));
  }
  if (*(int *)(in_RDI + 0x120) < 0) {
    *(undefined8 *)(in_RDI + 0x110) = 0;
  }
  else {
    if (in_RDX == 0) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0;
      __cxa_throw(puVar2,&NaException::typeinfo,0);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*(int *)(in_RDI + 0x120);
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)(in_RDI + 0x110) = pvVar4;
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x120); local_1c = local_1c + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x110) + (long)local_1c * 4) =
           *(undefined4 *)(in_RDX + (long)local_1c * 4);
    }
  }
  return;
}

Assistant:

void
NaPNFetcher::set_output (int nDim, const unsigned* piMap)
{
  check_tunable();

  nOutDim = nDim;
  delete[] piOutMap;

  if(nOutDim < 0)
    piOutMap = NULL;
  else if(NULL == piMap)
    throw(na_null_pointer);
  else
    {
      int	i;
      piOutMap = new unsigned[nOutDim];
      for(i = 0; i < nOutDim; ++i)
	piOutMap[i] = piMap[i];
    }
}